

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O0

bool __thiscall SSD1306::OledI2C::isSetPixel(OledI2C *this,OledPoint p)

{
  OledPoint p_00;
  OledPoint p_01;
  bool bVar1;
  byte *pbVar2;
  undefined8 in_RSI;
  array<SSD1306::OledI2C::PixelBlock,_32UL> *in_RDI;
  PixelOffset po;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  byte bVar3;
  int in_stack_ffffffffffffffd4;
  undefined1 local_1;
  
  p_00.m_y = in_stack_ffffffffffffffd4;
  p_00.m_x = in_stack_ffffffffffffffd0;
  bVar1 = OledPixel::pixelInside
                    ((OledPixel *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),p_00
                    );
  if (bVar1) {
    p_01.m_y = in_stack_ffffffffffffffd4;
    p_01.m_x = (int)((ulong)in_RSI >> 0x20);
    anon_unknown.dwarf_71aa::PixelOffset::PixelOffset
              ((PixelOffset *)CONCAT44((int)in_RSI,in_stack_ffffffffffffffc8),p_01);
    bVar3 = (byte)in_stack_ffffffffffffffd4;
    std::array<SSD1306::OledI2C::PixelBlock,_32UL>::operator[](in_RDI,in_stack_ffffffffffffffb8);
    pbVar2 = std::array<unsigned_char,_33UL>::operator[]
                       ((array<unsigned_char,_33UL> *)in_RDI,in_stack_ffffffffffffffb8);
    local_1 = ((uint)*pbVar2 & 1 << (bVar3 & 0x1f)) != 0;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
SSD1306::OledI2C::isSetPixel(
    SSD1306::OledPoint p) const
{
    if (not pixelInside(p))
    {
        return false;
    }

    PixelOffset po{p};

    return blocks_[po.block].bytes_[po.byte] & (1 << po.bit);
}